

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

void free_FMFormatList(FMFormatList format_list)

{
  FMFormatList p_Var1;
  char *__ptr;
  
  __ptr = format_list->format_name;
  if (__ptr != (char *)0x0) {
    p_Var1 = format_list + 1;
    do {
      free(__ptr);
      free_field_list(p_Var1[-1].field_list);
      if (p_Var1[-1].opt_info != (FMOptInfo *)0x0) {
        free(p_Var1[-1].opt_info);
      }
      __ptr = p_Var1->format_name;
      p_Var1 = p_Var1 + 1;
    } while (__ptr != (char *)0x0);
  }
  return;
}

Assistant:

extern void
free_FMFormatList(FMFormatList format_list)
{
    int i = 0;
    while(format_list[i].format_name){
	free((char*)format_list[i].format_name);
	free_field_list(format_list[i].field_list);
	if (format_list[i].opt_info) free(format_list[i].opt_info);
	i++;
    }
}